

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

int32_t try_to_int(string *s)

{
  pointer pcVar1;
  long *plVar2;
  int iVar3;
  int *piVar4;
  ulonglong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar1,pcVar1 + s->_M_string_length)
  ;
  plVar2 = local_70;
  if (local_68 != 0) {
    uVar7 = 0;
    do {
      iVar3 = isspace((uint)*(byte *)((long)plVar2 + uVar7));
      if (iVar3 == 0) goto joined_r0x001153dd;
      uVar7 = uVar7 + 1;
    } while (local_68 != uVar7);
  }
LAB_001153f9:
  std::__cxx11::string::substr((ulong)local_50,(ulong)&local_70);
  std::__cxx11::string::operator=((string *)s,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  plVar2 = (long *)(s->_M_dataplus)._M_p;
  if (((2 < s->_M_string_length) && ((char)*plVar2 == '0')) &&
     ((*(byte *)((long)plVar2 + 1) | 0x20) == 0x78)) {
    piVar4 = __errno_location();
    iVar3 = *piVar4;
    *piVar4 = 0;
    uVar5 = strtoull((char *)plVar2,(char **)local_50,0);
    if (local_50[0] == plVar2) goto LAB_00115513;
    if (*piVar4 != 0) {
      if (*piVar4 != 0x22) goto LAB_001154ec;
      std::__throw_out_of_range("stoull");
      goto LAB_001154ad;
    }
LAB_001154ea:
    *piVar4 = iVar3;
LAB_001154ec:
    return (int32_t)uVar5;
  }
LAB_001154ad:
  piVar4 = __errno_location();
  iVar3 = *piVar4;
  *piVar4 = 0;
  uVar5 = strtol((char *)plVar2,(char **)local_50,10);
  if (local_50[0] == plVar2) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((long)(int)uVar5 == uVar5) && (*piVar4 != 0x22)) {
    if (*piVar4 != 0) goto LAB_001154ec;
    goto LAB_001154ea;
  }
  std::__throw_out_of_range("stoi");
LAB_00115513:
  uVar6 = std::__throw_invalid_argument("stoull");
  if (*piVar4 == 0) {
    *piVar4 = iVar3;
  }
  _Unwind_Resume(uVar6);
joined_r0x001153dd:
  while ((uVar7 < local_68 &&
         (iVar3 = isspace((uint)*(byte *)((long)plVar2 + local_68)), iVar3 != 0))) {
    local_68 = local_68 - 1;
  }
  goto LAB_001153f9;
}

Assistant:

inline std::int32_t try_to_int(std::string s) {
    s = trim(s);
    if (s.length() > 2 && s[0] == '0' && (s[1] == 'x' || s[1] == 'X')) {
        return static_cast<std::int32_t>(std::stoull(s, 0, 0));
    }
    else {
        return std::stoi(s);
    }
}